

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::removeSatisfied(SimpSolver *this)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  ClauseAllocator *this_00;
  Clause *this_01;
  uint *puVar4;
  long in_RDI;
  Clause *unaff_retaddr;
  Solver *in_stack_00000008;
  bool in_stack_0000001b;
  CRef in_stack_0000001c;
  Clause *c;
  int j;
  int i;
  uint in_stack_ffffffffffffffcc;
  int local_10;
  int local_c;
  
  local_10 = 0;
  for (local_c = 0; iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x230)),
      local_c < iVar2; local_c = local_c + 1) {
    this_00 = (ClauseAllocator *)(in_RDI + 0x508);
    vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x230),local_c);
    this_01 = ClauseAllocator::operator[](this_00,in_stack_ffffffffffffffcc);
    uVar3 = Clause::mark(this_01);
    if (uVar3 == 0) {
      bVar1 = Solver::satisfied(in_stack_00000008,unaff_retaddr);
      if (bVar1) {
        vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x230),local_c);
        Solver::removeSatisfiedClause((Solver *)c,in_stack_0000001c,in_stack_0000001b);
      }
      else {
        puVar4 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x230),local_c);
        in_stack_ffffffffffffffcc = *puVar4;
        puVar4 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x230),local_10);
        *puVar4 = in_stack_ffffffffffffffcc;
        local_10 = local_10 + 1;
      }
    }
  }
  vec<unsigned_int>::shrink((vec<unsigned_int> *)(in_RDI + 0x230),local_c - local_10);
  return;
}

Assistant:

void SimpSolver::removeSatisfied()
{
    int i, j;
    for (i = j = 0; i < clauses.size(); i++) {
        const Clause &c = ca[clauses[i]];
        if (c.mark() == 0) {
            if (satisfied(c)) {
                removeSatisfiedClause(clauses[i]);
            } else {
                clauses[j++] = clauses[i];
            }
        }
    }
    clauses.shrink(i - j);
}